

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxTree.cpp
# Opt level: O0

shared_ptr<slang::syntax::SyntaxTree>
slang::syntax::SyntaxTree::fromLibraryMapBuffer
          (SourceBuffer *buffer,SourceManager *sourceManager,Bag *options)

{
  SourceBuffer buffer_00;
  LibraryMapSyntax *library;
  SourceManager *sourceManager_00;
  SyntaxTree *__p;
  Bag *in_RCX;
  value_type_pointer in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined8 *in_RSI;
  SyntaxTree *in_RDI;
  shared_ptr<slang::syntax::SyntaxTree> sVar1;
  LibraryMapSyntax *root;
  Parser parser;
  Preprocessor preprocessor;
  Diagnostics diagnostics;
  BumpAllocator alloc;
  Bag *pBVar2;
  BumpAllocator *in_stack_fffffffffffff6b0;
  Bag *this;
  Preprocessor *this_00;
  Parser *this_01;
  Preprocessor *in_stack_fffffffffffff6e0;
  Preprocessor *in_stack_fffffffffffff6e8;
  Parser *in_stack_fffffffffffff6f0;
  SyntaxTree *this_02;
  value_type_pointer ppVar3;
  ParserMetadata *metadata;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  *macros;
  Preprocessor *in_stack_fffffffffffff738;
  LibraryMapSyntax *local_888;
  Parser *in_stack_fffffffffffff7a8;
  Bag *in_stack_fffffffffffffbf8;
  Diagnostics *in_stack_fffffffffffffc00;
  BumpAllocator *in_stack_fffffffffffffc08;
  SourceManager *in_stack_fffffffffffffc10;
  Preprocessor *in_stack_fffffffffffffc18;
  span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>
  in_stack_fffffffffffffd90;
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  local_128 [10];
  Bag *local_20;
  value_type_pointer local_18;
  undefined8 *local_10;
  
  metadata = (ParserMetadata *)&stack0xffffffffffffffd0;
  this_02 = in_RDI;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  BumpAllocator::BumpAllocator(in_stack_fffffffffffff6b0);
  macros = local_128;
  Diagnostics::Diagnostics((Diagnostics *)0x578008);
  ppVar3 = local_18;
  std::span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL>::span
            ((span<const_slang::syntax::DefineDirectiveSyntax_*const,_18446744073709551615UL> *)
             0x57802f);
  parsing::Preprocessor::Preprocessor
            (in_stack_fffffffffffffc18,in_stack_fffffffffffffc10,in_stack_fffffffffffffc08,
             in_stack_fffffffffffffc00,in_stack_fffffffffffffbf8,in_stack_fffffffffffffd90);
  pBVar2 = (Bag *)*local_10;
  this = (Bag *)local_10[1];
  this_01 = (Parser *)local_10[3];
  buffer_00.data._M_str = &in_RDI->isLibraryUnit;
  buffer_00.data._M_len = (size_t)in_stack_fffffffffffff6f0;
  buffer_00.library = (SourceLibrary *)this_02;
  buffer_00._24_8_ = ppVar3;
  parsing::Preprocessor::pushSource(in_stack_fffffffffffff6e0,buffer_00);
  parsing::Parser::Parser
            (in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8,(Bag *)in_stack_fffffffffffff6e0);
  library = parsing::Parser::parseLibraryMap(in_stack_fffffffffffff7a8);
  local_888 = library;
  sourceManager_00 = (SourceManager *)operator_new(0x5780f2);
  __p = (SyntaxTree *)parsing::Parser::getMetadata(this_01);
  parsing::Preprocessor::getDefinedMacros(in_stack_fffffffffffff738);
  Bag::Bag(this,pBVar2);
  this_00 = (Preprocessor *)&stack0xfffffffffffff760;
  SyntaxTree(this_02,(SyntaxNode *)in_RDI,(SourceLibrary *)library,sourceManager_00,
             (BumpAllocator *)__p,(Diagnostics *)local_18,metadata,macros,local_20);
  std::shared_ptr<slang::syntax::SyntaxTree>::shared_ptr<slang::syntax::SyntaxTree,void>
            ((shared_ptr<slang::syntax::SyntaxTree> *)this_00,__p);
  Bag::~Bag((Bag *)0x5781d0);
  std::
  vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
  ::~vector((vector<const_slang::syntax::DefineDirectiveSyntax_*,_std::allocator<const_slang::syntax::DefineDirectiveSyntax_*>_>
             *)this_01);
  parsing::Parser::~Parser((Parser *)this_00);
  parsing::Preprocessor::~Preprocessor(this_00);
  Diagnostics::~Diagnostics((Diagnostics *)0x578204);
  BumpAllocator::~BumpAllocator((BumpAllocator *)this_00);
  sVar1.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this_02;
  return (shared_ptr<slang::syntax::SyntaxTree>)
         sVar1.super___shared_ptr<slang::syntax::SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<SyntaxTree> SyntaxTree::fromLibraryMapBuffer(const SourceBuffer& buffer,
                                                             SourceManager& sourceManager,
                                                             const Bag& options) {
    BumpAllocator alloc;
    Diagnostics diagnostics;
    Preprocessor preprocessor(sourceManager, alloc, diagnostics, options);
    preprocessor.pushSource(buffer);

    Parser parser(preprocessor, options);
    auto& root = parser.parseLibraryMap();

    return std::shared_ptr<SyntaxTree>(
        new SyntaxTree(&root, nullptr, sourceManager, std::move(alloc), std::move(diagnostics),
                       parser.getMetadata(), preprocessor.getDefinedMacros(), options));
}